

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O0

void __thiscall TrodesMsg::TrodesMsg(TrodesMsg *this,TrodesMsg *t)

{
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::operator=(in_RDI,in_RSI);
  *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)(in_RSI + 0x20);
  *(undefined8 *)(in_RSI + 0x20) = 0;
  return;
}

Assistant:

TrodesMsg::TrodesMsg(TrodesMsg&& t) {
    //TODO: find out if msg can be safely deallocated IF it cannot be guarenteed that it is already a NULL ptr
    format = t.format;
    msg = t.msg;
    t.msg = NULL;
}